

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O0

void listen_cb(uv_stream_t *handle,int status)

{
  int iVar1;
  int r;
  int status_local;
  uv_stream_t *handle_local;
  
  if ((echo_ctx *)handle != &ctx2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-send-recv.c"
            ,0x16a,"handle == (uv_stream_t*)&ctx2.listen");
    abort();
  }
  if (status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-send-recv.c"
            ,0x16b,"status == 0");
    abort();
  }
  iVar1 = uv_accept((uv_stream_t *)&ctx2,(uv_stream_t *)&ctx2.channel);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-send-recv.c"
            ,0x16e,"r == 0");
    abort();
  }
  send_recv_start();
  return;
}

Assistant:

static void listen_cb(uv_stream_t* handle, int status) {
  int r;
  ASSERT(handle == (uv_stream_t*)&ctx2.listen);
  ASSERT(status == 0);

  r = uv_accept((uv_stream_t*)&ctx2.listen, (uv_stream_t*)&ctx2.channel);
  ASSERT(r == 0);

  send_recv_start();
}